

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O0

void __thiscall Fl_Spinner::Fl_Spinner(Fl_Spinner *this,int X,int Y,int W,int H,char *L)

{
  int iVar1;
  char *L_local;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Spinner *this_local;
  
  Fl_Group::Fl_Group(&this->super_Fl_Group,X,Y,W,H,L);
  (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Spinner_002eba08;
  Fl_Input::Fl_Input(&this->input_,X,Y,(W + -2) - H / 2,H,(char *)0x0);
  iVar1 = H / 2;
  Fl_Repeat_Button::Fl_Repeat_Button
            (&this->up_button_,((X + W) - iVar1) + -2,Y,iVar1 + 2,iVar1,"@-42<");
  iVar1 = H / 2;
  Fl_Repeat_Button::Fl_Repeat_Button
            (&this->down_button_,((X + W) - iVar1) + -2,(Y + H) - iVar1,iVar1 + 2,iVar1,"@-42>");
  Fl_Group::end(&this->super_Fl_Group);
  this->value_ = 1.0;
  this->minimum_ = 1.0;
  this->maximum_ = 100.0;
  this->step_ = 1.0;
  this->format_ = "%g";
  Fl_Widget::align((Fl_Widget *)this,4);
  Fl_Input_::value(&(this->input_).super_Fl_Input_,"1");
  Fl_Widget::type((Fl_Widget *)&this->input_,'\x02');
  Fl_Widget::when((Fl_Widget *)&this->input_,'\f');
  Fl_Widget::callback((Fl_Widget *)&this->input_,sb_cb,this);
  Fl_Widget::callback((Fl_Widget *)&this->up_button_,sb_cb,this);
  Fl_Widget::callback((Fl_Widget *)&this->down_button_,sb_cb,this);
  return;
}

Assistant:

Fl_Spinner::Fl_Spinner(int X, int Y, int W, int H, const char *L)
: Fl_Group(X, Y, W, H, L),
  input_(X, Y, W - H / 2 - 2, H),
  up_button_(X + W - H / 2 - 2, Y, H / 2 + 2, H / 2, "@-42<"),
  down_button_(X + W - H / 2 - 2, Y + H - H / 2,
               H / 2 + 2, H / 2, "@-42>") 
{
  end();
  
  value_   = 1.0;
  minimum_ = 1.0;
  maximum_ = 100.0;
  step_    = 1.0;
  format_  = "%g";
  
  align(FL_ALIGN_LEFT);
  
  input_.value("1");
  input_.type(FL_INT_INPUT);
  input_.when(FL_WHEN_ENTER_KEY | FL_WHEN_RELEASE);
  input_.callback((Fl_Callback *)sb_cb, this);
  
  up_button_.callback((Fl_Callback *)sb_cb, this);
  
  down_button_.callback((Fl_Callback *)sb_cb, this);
}